

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_sct_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uint8_t *data;
  size_t len;
  bool bVar4;
  CBB contents;
  CBB local_50;
  
  if ((hs->field_0x6c8 & 4) == 0) {
    __assert_fail("hs->scts_requested",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x527,"bool bssl::ext_sct_add_serverhello(SSL_HANDSHAKE *, CBB *)");
  }
  ssl = hs->ssl;
  uVar2 = ssl_protocol_version(ssl);
  bVar4 = true;
  if ((((uVar2 < 0x304) && ((ssl->s3->field_0xdc & 0x20) == 0)) &&
      (bVar1 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar1)) &&
     ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
      *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
       &(((hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)->
        signed_cert_timestamp_list)._M_t.
        super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> != (crypto_buffer_st *)0x0)
     ) {
    iVar3 = CBB_add_u16(out,0x12);
    if ((iVar3 != 0) && (iVar3 = CBB_add_u16_length_prefixed(out,&local_50), iVar3 != 0)) {
      data = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                (((hs->credential)._M_t.
                                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)->
                                signed_cert_timestamp_list)._M_t.
                                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>);
      len = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                              (((hs->credential)._M_t.
                                super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)->
                              signed_cert_timestamp_list)._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>);
      iVar3 = CBB_add_bytes(&local_50,data,len);
      if (iVar3 != 0) {
        iVar3 = CBB_flush(out);
        return iVar3 != 0;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool ext_sct_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  assert(hs->scts_requested);
  // The extension shouldn't be sent when resuming sessions.
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION || ssl->s3->session_reused ||
      !ssl_cipher_uses_certificate_auth(hs->new_cipher) ||
      hs->credential->signed_cert_timestamp_list == nullptr) {
    return true;
  }

  CBB contents;
  return CBB_add_u16(out, TLSEXT_TYPE_certificate_timestamp) &&
         CBB_add_u16_length_prefixed(out, &contents) &&
         CBB_add_bytes(&contents,
                       CRYPTO_BUFFER_data(
                           hs->credential->signed_cert_timestamp_list.get()),
                       CRYPTO_BUFFER_len(
                           hs->credential->signed_cert_timestamp_list.get())) &&
         CBB_flush(out);
}